

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start_Resume_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Start_Resume_PDU::Start_Resume_PDU(Start_Resume_PDU *this)

{
  Start_Resume_PDU *this_local;
  
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Start_Resume_PDU_0032e7b8;
  DATA_TYPE::ClockTime::ClockTime(&this->m_RealWorldTime);
  DATA_TYPE::ClockTime::ClockTime(&this->m_SimTime);
  this->m_ui32RequestID = 0;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '\r';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x2c;
  return;
}

Assistant:

Start_Resume_PDU::Start_Resume_PDU() :
    m_ui32RequestID( 0 )
{
    m_ui8PDUType = Start_Resume_PDU_Type;
    m_ui16PDULength = START_RESUME_PDU_SIZE;
}